

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderBuiltinVarTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::sr::anon_unknown_1::BuiltinGlFragCoordWCase::createInstance
          (BuiltinGlFragCoordWCase *this,Context *context)

{
  BuiltinGlFragCoordWCaseInstance *this_00;
  Context *context_local;
  BuiltinGlFragCoordWCase *this_local;
  
  this_00 = (BuiltinGlFragCoordWCaseInstance *)operator_new(0x220);
  BuiltinGlFragCoordWCaseInstance::BuiltinGlFragCoordWCaseInstance(this_00,context);
  return (TestInstance *)this_00;
}

Assistant:

TestInstance* BuiltinGlFragCoordWCase::createInstance (Context& context) const
{
	return new BuiltinGlFragCoordWCaseInstance(context);
}